

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O2

void __thiscall cmConfigureLog::WriteValue(cmConfigureLog *this,string_view key,string *value)

{
  StreamWriter *pSVar1;
  ofstream *poVar2;
  ostream *poVar3;
  Value VStack_48;
  
  poVar2 = BeginLine(this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,key._M_str,
                      key._M_len);
  std::operator<<(poVar3,": ");
  pSVar1 = (this->Encoder)._M_t.
           super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
           super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
           super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl;
  Json::Value::Value(&VStack_48,value);
  (*pSVar1->_vptr_StreamWriter[2])(pSVar1,&VStack_48,&this->Stream);
  Json::Value::~Value(&VStack_48);
  std::endl<char,std::char_traits<char>>
            (&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>);
  return;
}

Assistant:

void cmConfigureLog::WriteValue(cm::string_view key, std::string const& value)
{
  this->BeginLine() << key << ": ";
  this->Encoder->write(value, &this->Stream);
  this->EndLine();
}